

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::saveOutput(FastText *this,string *filename)

{
  Dictionary *pDVar1;
  char cVar2;
  uint uVar3;
  ostream *poVar4;
  invalid_argument *piVar5;
  ulong i;
  Vector vec;
  string word;
  ofstream ofs;
  
  std::ofstream::ofstream(&ofs,(string *)filename,_S_out);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&word,filename," cannot be opened for saving vectors!");
    std::invalid_argument::invalid_argument(piVar5,(string *)&word);
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (this->quant_ != true) {
    pDVar1 = (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->model
        == sup) {
      uVar3 = Dictionary::nlabels(pDVar1);
    }
    else {
      uVar3 = Dictionary::nwords(pDVar1);
    }
    poVar4 = (ostream *)std::ostream::operator<<(&ofs,uVar3);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,((this->args_).
                                super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->dim);
    std::endl<char,std::char_traits<char>>(poVar4);
    Vector::Vector(&vec,(long)((this->args_).
                               super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                              )->dim);
    for (i = 0; (~((int)uVar3 >> 0x1f) & uVar3) != i; i = i + 1) {
      pDVar1 = (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          model == sup) {
        Dictionary::getLabel_abi_cxx11_(&word,pDVar1,(int32_t)i);
      }
      else {
        Dictionary::getWord_abi_cxx11_(&word,pDVar1,(int32_t)i);
      }
      Vector::zero(&vec);
      Vector::addRow(&vec,(this->output_).
                          super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,i)
      ;
      poVar4 = std::operator<<((ostream *)&ofs,(string *)&word);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = operator<<(poVar4,&vec);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)&word);
    }
    std::ofstream::close();
    free(vec.data_.mem_);
    std::ofstream::~ofstream(&ofs);
    return;
  }
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (piVar5,"Option -saveOutput is not supported for quantized models.");
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void FastText::saveOutput(const std::string& filename) {
  std::ofstream ofs(filename);
  if (!ofs.is_open()) {
    throw std::invalid_argument(
        filename + " cannot be opened for saving vectors!");
  }
  if (quant_) {
    throw std::invalid_argument(
        "Option -saveOutput is not supported for quantized models.");
  }
  int32_t n =
      (args_->model == model_name::sup) ? dict_->nlabels() : dict_->nwords();
  ofs << n << " " << args_->dim << std::endl;
  Vector vec(args_->dim);
  for (int32_t i = 0; i < n; i++) {
    std::string word = (args_->model == model_name::sup) ? dict_->getLabel(i)
                                                         : dict_->getWord(i);
    vec.zero();
    vec.addRow(*output_, i);
    ofs << word << " " << vec << std::endl;
  }
  ofs.close();
}